

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

void Js::JavascriptString::GetThisAndSearchStringArguments
               (ArgumentReader *args,ScriptContext *scriptContext,char16 *apiNameForErrorMsg,
               JavascriptString **ppThis,JavascriptString **ppSearch,bool isRegExpAnAllowedArg)

{
  bool bVar1;
  JavascriptString *pJVar2;
  Var pvVar3;
  
  GetThisStringArgument(args,scriptContext,apiNameForErrorMsg,ppThis);
  pJVar2 = StringCache::GetUndefinedDisplay
                     (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  if (((ulong)(args->super_Arguments).Info & 0xfffffe) != 0) {
    if (!isRegExpAnAllowedArg) {
      pvVar3 = Arguments::operator[](&args->super_Arguments,1);
      bVar1 = JavascriptRegExp::IsRegExpLike(pvVar3,scriptContext);
      if (bVar1) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9f8,apiNameForErrorMsg);
      }
    }
    pvVar3 = Arguments::operator[](&args->super_Arguments,1);
    bVar1 = VarIs<Js::JavascriptString>(pvVar3);
    if (bVar1) {
      pJVar2 = UnsafeVarTo<Js::JavascriptString>(pvVar3);
      if (pJVar2 != (JavascriptString *)0x0) goto LAB_00bbcd91;
    }
    pvVar3 = Arguments::operator[](&args->super_Arguments,1);
    pJVar2 = JavascriptConversion::ToString(pvVar3,scriptContext);
  }
LAB_00bbcd91:
  *ppSearch = pJVar2;
  return;
}

Assistant:

void JavascriptString::GetThisAndSearchStringArguments(ArgumentReader& args, ScriptContext* scriptContext, const char16* apiNameForErrorMsg, JavascriptString** ppThis, JavascriptString** ppSearch, bool isRegExpAnAllowedArg)
    {
        GetThisStringArgument(args, scriptContext, apiNameForErrorMsg, ppThis);

        JavascriptString * pSearch = scriptContext->GetLibrary()->GetUndefinedDisplayString();
        if (args.Info.Count > 1)
        {
            if (!isRegExpAnAllowedArg && JavascriptRegExp::IsRegExpLike(args[1], scriptContext))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_FirstCannotBeRegExp, apiNameForErrorMsg);
            }
            else
            {
                pSearch = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
                if (!pSearch)
                {
                    pSearch = JavascriptConversion::ToString(args[1], scriptContext);
                }
            }
        }

        *ppSearch = pSearch;
    }